

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void __thiscall
duckdb::AggregateExecutor::
UnaryUpdate<duckdb::AvgState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintAverageOperation>
          (AggregateExecutor *this,Vector *input,AggregateInputData *aggr_input_data,
          data_ptr_t state,idx_t count)

{
  undefined8 *puVar1;
  ulong uVar2;
  sel_t *psVar3;
  hugeint_t lhs;
  hugeint_t lhs_00;
  hugeint_t lhs_01;
  hugeint_t rhs;
  hugeint_t rhs_00;
  hugeint_t rhs_01;
  hugeint_t rhs_02;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  ulong uVar6;
  ulong uVar7;
  data_ptr_t pdVar8;
  data_ptr_t pdVar9;
  data_ptr_t pdVar10;
  FunctionData *pFVar11;
  hugeint_t hVar12;
  hugeint_t input_00;
  UnifiedVectorFormat idata;
  uint64_t in_stack_ffffffffffffff58;
  int64_t in_stack_ffffffffffffff60;
  uint64_t in_stack_ffffffffffffff68;
  long lVar13;
  uint64_t uVar14;
  int64_t in_stack_ffffffffffffff70;
  UnifiedVectorFormat local_78;
  
  if (*this == (AggregateExecutor)0x0) {
    lVar13 = *(long *)(this + 0x20);
    FlatVector::VerifyFlatVector((Vector *)this);
    pdVar10 = state + 0x3f;
    if ((data_ptr_t)0x3f < pdVar10) {
      uVar14 = lVar13 + 8;
      uVar6 = 0;
      pdVar8 = (data_ptr_t)0x0;
      pdVar5 = state;
      do {
        if (*(long *)(this + 0x28) == 0) {
          pdVar9 = pdVar8 + 0x40;
          if (state <= pdVar8 + 0x40) {
            pdVar9 = state;
          }
LAB_017fd00d:
          pdVar4 = pdVar8;
          if (pdVar8 < pdVar9) {
            pFVar11 = (aggr_input_data->bind_data).ptr;
            do {
              pFVar11 = (FunctionData *)((long)&pFVar11->_vptr_FunctionData + 1);
              (aggr_input_data->bind_data).ptr = pFVar11;
              hVar12.upper = uVar6;
              hVar12.lower = in_stack_ffffffffffffff58;
              rhs_00.upper = (int64_t)pdVar5;
              rhs_00.lower = uVar14;
              hVar12 = Hugeint::Add<true>(hVar12,rhs_00);
              *(hugeint_t *)&aggr_input_data->allocator = hVar12;
              pdVar8 = pdVar8 + 1;
              state = pdVar5;
              pdVar4 = pdVar9;
            } while (pdVar9 != pdVar8);
          }
        }
        else {
          uVar2 = *(ulong *)(*(long *)(this + 0x28) + uVar6 * 8);
          pdVar9 = pdVar8 + 0x40;
          if (state <= pdVar8 + 0x40) {
            pdVar9 = state;
          }
          if (uVar2 == 0xffffffffffffffff) goto LAB_017fd00d;
          pdVar4 = pdVar9;
          if ((uVar2 != 0) && (state = pdVar5, pdVar4 = pdVar8, pdVar8 < pdVar9)) {
            uVar7 = 0;
            do {
              if ((uVar2 >> (uVar7 & 0x3f) & 1) != 0) {
                (aggr_input_data->bind_data).ptr =
                     (FunctionData *)
                     ((long)&((aggr_input_data->bind_data).ptr)->_vptr_FunctionData + 1);
                lhs.upper = uVar6;
                lhs.lower = in_stack_ffffffffffffff58;
                rhs.upper = (int64_t)pdVar5;
                rhs.lower = uVar14;
                hVar12 = Hugeint::Add<true>(lhs,rhs);
                *(hugeint_t *)&aggr_input_data->allocator = hVar12;
              }
              uVar7 = uVar7 + 1;
              state = pdVar5;
              pdVar4 = pdVar9;
            } while ((long)pdVar9 - (long)pdVar8 != uVar7);
          }
        }
        pdVar8 = pdVar4;
        uVar6 = uVar6 + 1;
      } while (uVar6 != (ulong)pdVar10 >> 6);
    }
  }
  else if (*this == (AggregateExecutor)0x2) {
    if ((*(byte **)(this + 0x28) == (byte *)0x0) || ((**(byte **)(this + 0x28) & 1) != 0)) {
      puVar1 = *(undefined8 **)(this + 0x20);
      (aggr_input_data->bind_data).ptr =
           (FunctionData *)(state + (long)(aggr_input_data->bind_data).ptr);
      input_00.upper = (int64_t)state;
      input_00.lower = puVar1[1];
      HugeintAdd::AddConstant<duckdb::AvgState<duckdb::hugeint_t>,duckdb::hugeint_t>
                ((HugeintAdd *)aggr_input_data,(AvgState<duckdb::hugeint_t> *)*puVar1,input_00,count
                );
      return;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat((Vector *)this,(idx_t)state,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (state != (data_ptr_t)0x0) {
        pFVar11 = (aggr_input_data->bind_data).ptr;
        pdVar10 = (data_ptr_t)0x0;
        do {
          (aggr_input_data->bind_data).ptr =
               (FunctionData *)(pdVar10 + (long)((long)&pFVar11->_vptr_FunctionData + 1));
          lhs_01.upper = in_stack_ffffffffffffff60;
          lhs_01.lower = in_stack_ffffffffffffff58;
          rhs_02.upper = in_stack_ffffffffffffff70;
          rhs_02.lower = in_stack_ffffffffffffff68;
          hVar12 = Hugeint::Add<true>(lhs_01,rhs_02);
          *(hugeint_t *)&aggr_input_data->allocator = hVar12;
          pdVar10 = pdVar10 + 1;
        } while (state != pdVar10);
      }
    }
    else if (state != (data_ptr_t)0x0) {
      psVar3 = (local_78.sel)->sel_vector;
      pdVar10 = (data_ptr_t)0x0;
      do {
        pdVar5 = pdVar10;
        if (psVar3 != (sel_t *)0x0) {
          pdVar5 = (data_ptr_t)(ulong)psVar3[(long)pdVar10];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [(ulong)pdVar5 >> 6] >> ((ulong)pdVar5 & 0x3f) & 1) != 0)) {
          (aggr_input_data->bind_data).ptr =
               (FunctionData *)((long)&((aggr_input_data->bind_data).ptr)->_vptr_FunctionData + 1);
          lhs_00.upper = in_stack_ffffffffffffff60;
          lhs_00.lower = in_stack_ffffffffffffff58;
          rhs_01.upper = in_stack_ffffffffffffff70;
          rhs_01.lower = in_stack_ffffffffffffff68;
          hVar12 = Hugeint::Add<true>(lhs_00,rhs_01);
          *(hugeint_t *)&aggr_input_data->allocator = hVar12;
        }
        pdVar10 = pdVar10 + 1;
      } while (state != pdVar10);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}